

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiIO::AddFocusEvent(ImGuiIO *this,bool focused)

{
  int *piVar1;
  ImGuiInputEvent *pIVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  long lVar5;
  ImGuiInputEvent *__dest;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  anon_union_12_6_fccad779_for_ImGuiInputEvent_2 *paVar9;
  int iVar10;
  ImGuiContext *g;
  
  pIVar3 = GImGui;
  iVar4 = (GImGui->InputEventsQueue).Size;
  lVar5 = (long)iVar4;
  if (0 < lVar5) {
    uVar8 = lVar5 + 1;
    paVar9 = &(GImGui->InputEventsQueue).Data[lVar5 + -1].field_2;
    do {
      if (((ImGuiInputEvent *)((long)paVar9 + -8))->Type == ImGuiInputEventType_Focus) {
        bVar6 = (paVar9->AppFocused).Focused;
        goto LAB_001dccdd;
      }
      uVar8 = uVar8 - 1;
      paVar9 = paVar9 + -2;
    } while (1 < uVar8);
  }
  bVar6 = (GImGui->IO).AppFocusLost ^ 1;
LAB_001dccdd:
  if ((bool)bVar6 != focused) {
    if (iVar4 == (GImGui->InputEventsQueue).Capacity) {
      if (iVar4 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar4 / 2 + iVar4;
      }
      iVar10 = iVar4 + 1;
      if (iVar4 + 1 < iVar7) {
        iVar10 = iVar7;
      }
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
      __dest = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)((long)iVar10 * 0x18,GImAllocatorUserData)
      ;
      pIVar2 = (pIVar3->InputEventsQueue).Data;
      if (pIVar2 != (ImGuiInputEvent *)0x0) {
        memcpy(__dest,pIVar2,(long)(pIVar3->InputEventsQueue).Size * 0x18);
        pIVar2 = (pIVar3->InputEventsQueue).Data;
        if ((pIVar2 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
      }
      (pIVar3->InputEventsQueue).Data = __dest;
      (pIVar3->InputEventsQueue).Capacity = iVar10;
      iVar4 = (pIVar3->InputEventsQueue).Size;
    }
    else {
      __dest = (GImGui->InputEventsQueue).Data;
    }
    __dest[iVar4].Type = ImGuiInputEventType_Focus;
    __dest[iVar4].Source = ImGuiInputSource_None;
    __dest[iVar4].field_2.AppFocused.Focused = focused;
    *(undefined8 *)((long)&__dest[iVar4].field_2 + 1) = 0;
    *(undefined8 *)((long)&__dest[iVar4].field_2 + 8) = 0;
    (pIVar3->InputEventsQueue).Size = (pIVar3->InputEventsQueue).Size + 1;
  }
  return;
}

Assistant:

void ImGuiIO::AddFocusEvent(bool focused)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");

    // Filter duplicate
    const ImGuiInputEvent* latest_event = FindLatestInputEvent(ImGuiInputEventType_Focus);
    const bool latest_focused = latest_event ? latest_event->AppFocused.Focused : !g.IO.AppFocusLost;
    if (latest_focused == focused)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Focus;
    e.AppFocused.Focused = focused;
    g.InputEventsQueue.push_back(e);
}